

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

sds sdsRemoveFreeSpace(sds s)

{
  byte bVar1;
  byte type_00;
  int iVar2;
  int iVar3;
  size_t string_size;
  void *pvVar4;
  size_t len;
  int hdrlen;
  char oldtype;
  char type;
  void *newsh;
  void *sh;
  sds s_local;
  
  bVar1 = s[-1];
  string_size = sdslen(s);
  iVar2 = sdsHdrSize(bVar1 & 7);
  type_00 = sdsReqType(string_size);
  iVar3 = sdsHdrSize(type_00);
  if ((bVar1 & 7) == type_00) {
    pvVar4 = realloc(s + -(long)iVar2,(long)iVar3 + string_size + 1);
    if (pvVar4 == (void *)0x0) {
      return (sds)0x0;
    }
    sh = (void *)((long)pvVar4 + (long)iVar3);
  }
  else {
    pvVar4 = malloc((long)iVar3 + string_size + 1);
    if (pvVar4 == (void *)0x0) {
      return (sds)0x0;
    }
    memcpy((void *)((long)pvVar4 + (long)iVar3),s,string_size + 1);
    free(s + -(long)iVar2);
    sh = (void *)((long)pvVar4 + (long)iVar3);
    *(byte *)((long)sh + -1) = type_00;
    sdssetlen((sds)sh,string_size);
  }
  sdssetalloc((sds)sh,string_size);
  return (sds)sh;
}

Assistant:

sds sdsRemoveFreeSpace(sds s) {
    void *sh, *newsh;
    char type, oldtype = s[-1] & SDS_TYPE_MASK;
    int hdrlen;
    size_t len = sdslen(s);
    sh = (char*)s-sdsHdrSize(oldtype);

    type = sdsReqType(len);
    hdrlen = sdsHdrSize(type);
    if (oldtype==type) {
        newsh = s_realloc(sh, hdrlen+len+1);
        if (newsh == NULL) return NULL;
        s = (char*)newsh+hdrlen;
    } else {
        newsh = s_malloc(hdrlen+len+1);
        if (newsh == NULL) return NULL;
        memcpy((char*)newsh+hdrlen, s, len+1);
        s_free(sh);
        s = (char*)newsh+hdrlen;
        s[-1] = type;
        sdssetlen(s, len);
    }
    sdssetalloc(s, len);
    return s;
}